

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O2

bool anon_unknown.dwarf_1e2dea::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int lx,int rx,int ly,int ry,int width)

{
  ostream *poVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  lVar4 = (long)ly;
  puVar2 = ph->_data + ph->_sizeY * lVar4;
  iVar5 = ly * width;
  do {
    lVar6 = (long)lx;
    if (ry < lVar4) {
LAB_0016d424:
      return ry < lVar4;
    }
    for (; lVar6 <= rx; lVar6 = lVar6 + 1) {
      uVar3 = (iVar5 + (int)lVar6) % 0x801;
      if (puVar2[lVar6] != uVar3) {
        poVar1 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar6);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar4);
        poVar1 = std::operator<<(poVar1,": ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,", should be ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::ostream::flush();
        goto LAB_0016d424;
      }
    }
    lVar4 = lVar4 + 1;
    puVar2 = puVar2 + ph->_sizeY;
    iVar5 = iVar5 + width;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
    return true;
}